

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

string * __thiscall
XmlRpc::XmlRpcValue::binaryToXml_abi_cxx11_(string *__return_storage_ptr__,XmlRpcValue *this)

{
  size_type sVar1;
  char *code_in;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  Encoder encoder;
  Encoder local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<value>","");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  sVar1 = __return_storage_ptr__->_M_string_length;
  lVar5 = (long)(((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl
                .super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    cVar7 = '\x01';
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lVar5 + 2;
    uVar6 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
    cVar7 = (char)((uVar6 + 0x47) / 0x48) + (char)uVar6;
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar7 + (char)sVar1);
  base64::Encoder::Encoder(&local_30,0x200);
  code_in = *(char **)(this->_value).asTime;
  iVar3 = base64::Encoder::encode
                    (&local_30,code_in,((this->_value).asTime)->tm_hour - (int)code_in,
                     (__return_storage_ptr__->_M_dataplus)._M_p + sVar1);
  iVar4 = base64::Encoder::encode_end
                    (&local_30,(__return_storage_ptr__->_M_dataplus)._M_p + sVar1 + (long)iVar3);
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)(sVar1 + (long)iVar3) + (char)iVar4);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XmlRpcValue::binaryToXml() const
  {
    // Wrap with xml
    std::string xml = VALUE_TAG;
    xml += BASE64_TAG;

    std::size_t offset = xml.size();
    // might reserve too much, we'll shrink later
    xml.resize(xml.size() + base64EncodedSize(_value.asBinary->size()));

    base64::Encoder encoder;
    offset += encoder.encode(_value.asBinary->data(), _value.asBinary->size(), &xml[offset]);
    offset += encoder.encode_end(&xml[offset]);
    xml.resize(offset);

    xml += BASE64_ETAG;
    xml += VALUE_ETAG;
    return xml;
  }